

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.cc
# Opt level: O0

void * hash_scan(hash *hash,hash_check_func *check_func,void *ctx)

{
  avl_node *paVar1;
  undefined8 in_RDX;
  code *in_RSI;
  ulong *in_RDI;
  hash_elem *h;
  avl_node *node;
  void *ret;
  size_t i;
  avl_node *local_38;
  void *local_30;
  ulong local_28;
  
  local_30 = (void *)0x0;
  local_28 = 0;
  do {
    if (*in_RDI <= local_28) {
      return local_30;
    }
    local_38 = avl_first((avl_tree *)(in_RDI[1] + local_28 * 0x10));
    while (local_38 != (avl_node *)0x0) {
      paVar1 = avl_next(local_38);
      local_30 = (void *)(*in_RSI)(local_38,in_RDX);
      local_38 = paVar1;
      if (local_30 != (void *)0x0) {
        return local_30;
      }
    }
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

void *hash_scan(struct hash *hash, hash_check_func *check_func, void *ctx)
{
    size_t i;
    void *ret = NULL;

#ifdef _HASH_TREE
    struct avl_node *node;
#else
    struct list_elem *e;
#endif

    struct hash_elem *h;

    for (i=0;i<hash->nbuckets;++i){
#ifdef _HASH_TREE
        node = avl_first(hash->buckets + i);
        while(node){
            h = _get_entry(node, struct hash_elem, avl);
            node = avl_next(node);
            ret = check_func(h, ctx);
            if (ret) {
                return ret;
            }
        }

#else
        e = list_begin(hash->buckets + i);
        while(e) {
            h = _get_entry(e, struct hash_elem, list_elem);
            ret = check_func(h, ctx);
            if (ret) {
                return ret;
            }
            e = list_next(e);
        }

#endif
    }
    return ret;
}